

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void av1_dr_prediction_z1_avx2
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int dx,int dy)

{
  uint8_t uVar1;
  ushort uVar2;
  undefined8 uVar3;
  uint uVar4;
  long lVar5;
  undefined8 *puVar6;
  byte bVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [16];
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ushort uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined8 local_438 [129];
  
  uVar8 = (ulong)(uint)bh;
  bVar7 = (byte)upsample_above;
  if (bw < 0x10) {
    if (bw == 4) {
      iVar10 = bh + 3 << (bVar7 & 0x1f);
      if (0 < bh) {
        uVar1 = above[iVar10];
        auVar14[1] = uVar1;
        auVar14[0] = uVar1;
        auVar14[2] = uVar1;
        auVar14[3] = uVar1;
        auVar14[4] = uVar1;
        auVar14[5] = uVar1;
        auVar14[6] = uVar1;
        auVar14[7] = uVar1;
        auVar14[8] = uVar1;
        auVar14[9] = uVar1;
        auVar14[10] = uVar1;
        auVar14[0xb] = uVar1;
        auVar14[0xc] = uVar1;
        auVar14[0xd] = uVar1;
        auVar14[0xe] = uVar1;
        auVar14[0xf] = uVar1;
        pauVar9 = (undefined1 (*) [16])local_438;
        uVar13 = 0;
        auVar26._8_2_ = 0x10;
        auVar26._0_8_ = 0x10001000100010;
        auVar26._10_2_ = 0x10;
        auVar26._12_2_ = 0x10;
        auVar26._14_2_ = 0x10;
        auVar26._16_2_ = 0x10;
        auVar26._18_2_ = 0x10;
        auVar26._20_2_ = 0x10;
        auVar26._22_2_ = 0x10;
        auVar26._24_2_ = 0x10;
        auVar26._26_2_ = 0x10;
        auVar26._28_2_ = 0x10;
        auVar26._30_2_ = 0x10;
        auVar19._8_2_ = 0x1f;
        auVar19._0_8_ = 0x1f001f001f001f;
        auVar19._10_2_ = 0x1f;
        auVar19._12_2_ = 0x1f;
        auVar19._14_2_ = 0x1f;
        auVar19._16_2_ = 0x1f;
        auVar19._18_2_ = 0x1f;
        auVar19._20_2_ = 0x1f;
        auVar19._22_2_ = 0x1f;
        auVar19._24_2_ = 0x1f;
        auVar19._26_2_ = 0x1f;
        auVar19._28_2_ = 0x1f;
        auVar19._30_2_ = 0x1f;
        uVar11 = dx;
        do {
          iVar12 = (int)uVar11 >> (6 - bVar7 & 0x1f);
          uVar4 = iVar10 - iVar12 >> (bVar7 & 0x1f);
          if ((int)uVar4 < 1) {
            if ((int)uVar13 < bh) {
              lVar5 = uVar8 - uVar13;
              do {
                *pauVar9 = auVar14;
                pauVar9 = pauVar9 + 1;
                lVar5 = lVar5 + -1;
              } while (lVar5 != 0);
            }
            break;
          }
          if (3 < uVar4) {
            uVar4 = 4;
          }
          auVar21 = *(undefined1 (*) [16])(above + iVar12);
          if (upsample_above == 0) {
            auVar20 = *(undefined1 (*) [16])(above + (long)iVar12 + 1);
            uVar2 = (ushort)(uVar11 >> 1);
            uVar22 = uVar2 & 0x1f;
            auVar29._0_8_ = CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2))) & 0x1f001f001f001f
            ;
            auVar29._8_2_ = uVar22;
            auVar29._10_2_ = uVar22;
            auVar29._12_2_ = uVar22;
            auVar29._14_2_ = uVar22;
            auVar29._16_2_ = uVar22;
            auVar29._18_2_ = uVar22;
            auVar29._20_2_ = uVar22;
            auVar29._22_2_ = uVar22;
            auVar29._24_2_ = uVar22;
            auVar29._26_2_ = uVar22;
            auVar29._28_2_ = uVar22;
            auVar29._30_2_ = uVar22;
          }
          else {
            auVar21 = vpshufb_avx(auVar21,_DAT_0051d130);
            auVar20 = vpsrldq_avx(auVar21,8);
            auVar28._0_2_ = (undefined2)uVar11;
            auVar28._2_2_ = auVar28._0_2_;
            auVar28._4_2_ = auVar28._0_2_;
            auVar28._6_2_ = auVar28._0_2_;
            auVar28._8_2_ = auVar28._0_2_;
            auVar28._10_2_ = auVar28._0_2_;
            auVar28._12_2_ = auVar28._0_2_;
            auVar28._14_2_ = auVar28._0_2_;
            auVar28._16_2_ = auVar28._0_2_;
            auVar28._18_2_ = auVar28._0_2_;
            auVar28._20_2_ = auVar28._0_2_;
            auVar28._22_2_ = auVar28._0_2_;
            auVar28._24_2_ = auVar28._0_2_;
            auVar28._26_2_ = auVar28._0_2_;
            auVar28._28_2_ = auVar28._0_2_;
            auVar28._30_2_ = auVar28._0_2_;
            auVar29 = vpsllw_avx2(auVar28,ZEXT416((uint)upsample_above));
            auVar29 = vpsrlw_avx2(auVar29,1);
            auVar29 = vpand_avx2(auVar29,auVar19);
          }
          auVar28 = vpmovzxbw_avx2(auVar21);
          auVar15 = vpmovzxbw_avx2(auVar20);
          auVar15 = vpsubw_avx2(auVar15,auVar28);
          auVar15 = vpmullw_avx2(auVar15,auVar29);
          auVar29 = vpsllw_avx2(auVar28,5);
          auVar29 = vpaddw_avx2(auVar29,auVar26);
          auVar29 = vpaddw_avx2(auVar15,auVar29);
          auVar29 = vpsrlw_avx2(auVar29,5);
          auVar21 = vpackuswb_avx(auVar29._0_16_,auVar29._16_16_);
          auVar21 = vpblendvb_avx(auVar14,auVar21,*(undefined1 (*) [16])BaseMask[uVar4]);
          *pauVar9 = auVar21;
          uVar11 = uVar11 + dx;
          uVar13 = uVar13 + 1;
          pauVar9 = pauVar9 + 1;
        } while (uVar8 != uVar13);
        puVar6 = local_438;
        do {
          *(undefined4 *)dst = *(undefined4 *)puVar6;
          dst = dst + stride;
          puVar6 = puVar6 + 2;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
    }
    else if ((bw == 8) && (iVar10 = bh + 7 << (bVar7 & 0x1f), 0 < bh)) {
      uVar1 = above[iVar10];
      auVar21[1] = uVar1;
      auVar21[0] = uVar1;
      auVar21[2] = uVar1;
      auVar21[3] = uVar1;
      auVar21[4] = uVar1;
      auVar21[5] = uVar1;
      auVar21[6] = uVar1;
      auVar21[7] = uVar1;
      auVar21[8] = uVar1;
      auVar21[9] = uVar1;
      auVar21[10] = uVar1;
      auVar21[0xb] = uVar1;
      auVar21[0xc] = uVar1;
      auVar21[0xd] = uVar1;
      auVar21[0xe] = uVar1;
      auVar21[0xf] = uVar1;
      pauVar9 = (undefined1 (*) [16])local_438;
      uVar13 = 0;
      auVar15._8_2_ = 0x10;
      auVar15._0_8_ = 0x10001000100010;
      auVar15._10_2_ = 0x10;
      auVar15._12_2_ = 0x10;
      auVar15._14_2_ = 0x10;
      auVar15._16_2_ = 0x10;
      auVar15._18_2_ = 0x10;
      auVar15._20_2_ = 0x10;
      auVar15._22_2_ = 0x10;
      auVar15._24_2_ = 0x10;
      auVar15._26_2_ = 0x10;
      auVar15._28_2_ = 0x10;
      auVar15._30_2_ = 0x10;
      auVar17._8_2_ = 0x1f;
      auVar17._0_8_ = 0x1f001f001f001f;
      auVar17._10_2_ = 0x1f;
      auVar17._12_2_ = 0x1f;
      auVar17._14_2_ = 0x1f;
      auVar17._16_2_ = 0x1f;
      auVar17._18_2_ = 0x1f;
      auVar17._20_2_ = 0x1f;
      auVar17._22_2_ = 0x1f;
      auVar17._24_2_ = 0x1f;
      auVar17._26_2_ = 0x1f;
      auVar17._28_2_ = 0x1f;
      auVar17._30_2_ = 0x1f;
      uVar11 = dx;
      do {
        iVar12 = (int)uVar11 >> (6 - bVar7 & 0x1f);
        uVar4 = iVar10 - iVar12 >> (bVar7 & 0x1f);
        if ((int)uVar4 < 1) {
          if ((int)uVar13 < bh) {
            lVar5 = uVar8 - uVar13;
            do {
              *pauVar9 = auVar21;
              pauVar9 = pauVar9 + 1;
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
          }
          break;
        }
        if (7 < uVar4) {
          uVar4 = 8;
        }
        auVar14 = *(undefined1 (*) [16])(above + iVar12);
        if (upsample_above == 0) {
          auVar20 = *(undefined1 (*) [16])(above + (long)iVar12 + 1);
          uVar2 = (ushort)(uVar11 >> 1);
          uVar22 = uVar2 & 0x1f;
          auVar24._0_8_ = CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2))) & 0x1f001f001f001f;
          auVar24._8_2_ = uVar22;
          auVar24._10_2_ = uVar22;
          auVar24._12_2_ = uVar22;
          auVar24._14_2_ = uVar22;
          auVar24._16_2_ = uVar22;
          auVar24._18_2_ = uVar22;
          auVar24._20_2_ = uVar22;
          auVar24._22_2_ = uVar22;
          auVar24._24_2_ = uVar22;
          auVar24._26_2_ = uVar22;
          auVar24._28_2_ = uVar22;
          auVar24._30_2_ = uVar22;
        }
        else {
          auVar14 = vpshufb_avx(auVar14,_DAT_0051d130);
          auVar20 = vpsrldq_avx(auVar14,8);
          auVar23._0_2_ = (undefined2)uVar11;
          auVar23._2_2_ = auVar23._0_2_;
          auVar23._4_2_ = auVar23._0_2_;
          auVar23._6_2_ = auVar23._0_2_;
          auVar23._8_2_ = auVar23._0_2_;
          auVar23._10_2_ = auVar23._0_2_;
          auVar23._12_2_ = auVar23._0_2_;
          auVar23._14_2_ = auVar23._0_2_;
          auVar23._16_2_ = auVar23._0_2_;
          auVar23._18_2_ = auVar23._0_2_;
          auVar23._20_2_ = auVar23._0_2_;
          auVar23._22_2_ = auVar23._0_2_;
          auVar23._24_2_ = auVar23._0_2_;
          auVar23._26_2_ = auVar23._0_2_;
          auVar23._28_2_ = auVar23._0_2_;
          auVar23._30_2_ = auVar23._0_2_;
          auVar26 = vpsllw_avx2(auVar23,ZEXT416((uint)upsample_above));
          auVar26 = vpsrlw_avx2(auVar26,1);
          auVar24 = vpand_avx2(auVar26,auVar17);
        }
        auVar26 = vpmovzxbw_avx2(auVar14);
        auVar19 = vpmovzxbw_avx2(auVar20);
        auVar19 = vpsubw_avx2(auVar19,auVar26);
        auVar19 = vpmullw_avx2(auVar19,auVar24);
        auVar26 = vpsllw_avx2(auVar26,5);
        auVar26 = vpaddw_avx2(auVar26,auVar15);
        auVar26 = vpaddw_avx2(auVar19,auVar26);
        auVar26 = vpsrlw_avx2(auVar26,5);
        auVar14 = vpackuswb_avx(auVar26._0_16_,auVar26._16_16_);
        auVar14 = vpblendvb_avx(auVar21,auVar14,*(undefined1 (*) [16])BaseMask[uVar4]);
        *pauVar9 = auVar14;
        uVar11 = uVar11 + dx;
        uVar13 = uVar13 + 1;
        pauVar9 = pauVar9 + 1;
      } while (uVar8 != uVar13);
      puVar6 = local_438;
      do {
        *(undefined8 *)dst = *puVar6;
        puVar6 = puVar6 + 2;
        dst = dst + stride;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  else if (bw == 0x10) {
    iVar10 = bh + 0xf << (bVar7 & 0x1f);
    if (0 < bh) {
      uVar1 = above[iVar10];
      auVar20[1] = uVar1;
      auVar20[0] = uVar1;
      auVar20[2] = uVar1;
      auVar20[3] = uVar1;
      auVar20[4] = uVar1;
      auVar20[5] = uVar1;
      auVar20[6] = uVar1;
      auVar20[7] = uVar1;
      auVar20[8] = uVar1;
      auVar20[9] = uVar1;
      auVar20[10] = uVar1;
      auVar20[0xb] = uVar1;
      auVar20[0xc] = uVar1;
      auVar20[0xd] = uVar1;
      auVar20[0xe] = uVar1;
      auVar20[0xf] = uVar1;
      pauVar9 = (undefined1 (*) [16])local_438;
      uVar13 = 0;
      auVar16._8_2_ = 0x10;
      auVar16._0_8_ = 0x10001000100010;
      auVar16._10_2_ = 0x10;
      auVar16._12_2_ = 0x10;
      auVar16._14_2_ = 0x10;
      auVar16._16_2_ = 0x10;
      auVar16._18_2_ = 0x10;
      auVar16._20_2_ = 0x10;
      auVar16._22_2_ = 0x10;
      auVar16._24_2_ = 0x10;
      auVar16._26_2_ = 0x10;
      auVar16._28_2_ = 0x10;
      auVar16._30_2_ = 0x10;
      auVar18._8_2_ = 0x1f;
      auVar18._0_8_ = 0x1f001f001f001f;
      auVar18._10_2_ = 0x1f;
      auVar18._12_2_ = 0x1f;
      auVar18._14_2_ = 0x1f;
      auVar18._16_2_ = 0x1f;
      auVar18._18_2_ = 0x1f;
      auVar18._20_2_ = 0x1f;
      auVar18._22_2_ = 0x1f;
      auVar18._24_2_ = 0x1f;
      auVar18._26_2_ = 0x1f;
      auVar18._28_2_ = 0x1f;
      auVar18._30_2_ = 0x1f;
      uVar11 = dx;
      do {
        iVar12 = (int)uVar11 >> (6 - bVar7 & 0x1f);
        uVar4 = iVar10 - iVar12 >> (bVar7 & 0x1f);
        if ((int)uVar4 < 1) {
          if ((int)uVar13 < bh) {
            lVar5 = uVar8 - uVar13;
            do {
              *pauVar9 = auVar20;
              pauVar9 = pauVar9 + 1;
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
          }
          break;
        }
        if (0xf < uVar4) {
          uVar4 = 0x10;
        }
        auVar14 = *(undefined1 (*) [16])(above + iVar12);
        if (upsample_above == 0) {
          auVar21 = *(undefined1 (*) [16])(above + (long)iVar12 + 1);
          uVar2 = (ushort)(uVar11 >> 1);
          uVar22 = uVar2 & 0x1f;
          auVar27._0_8_ = CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2))) & 0x1f001f001f001f;
          auVar27._8_2_ = uVar22;
          auVar27._10_2_ = uVar22;
          auVar27._12_2_ = uVar22;
          auVar27._14_2_ = uVar22;
          auVar27._16_2_ = uVar22;
          auVar27._18_2_ = uVar22;
          auVar27._20_2_ = uVar22;
          auVar27._22_2_ = uVar22;
          auVar27._24_2_ = uVar22;
          auVar27._26_2_ = uVar22;
          auVar27._28_2_ = uVar22;
          auVar27._30_2_ = uVar22;
        }
        else {
          auVar14 = vpshufb_avx(auVar14,_DAT_0051d130);
          auVar21 = vpsrldq_avx(auVar14,8);
          auVar25._0_2_ = (undefined2)uVar11;
          auVar25._2_2_ = auVar25._0_2_;
          auVar25._4_2_ = auVar25._0_2_;
          auVar25._6_2_ = auVar25._0_2_;
          auVar25._8_2_ = auVar25._0_2_;
          auVar25._10_2_ = auVar25._0_2_;
          auVar25._12_2_ = auVar25._0_2_;
          auVar25._14_2_ = auVar25._0_2_;
          auVar25._16_2_ = auVar25._0_2_;
          auVar25._18_2_ = auVar25._0_2_;
          auVar25._20_2_ = auVar25._0_2_;
          auVar25._22_2_ = auVar25._0_2_;
          auVar25._24_2_ = auVar25._0_2_;
          auVar25._26_2_ = auVar25._0_2_;
          auVar25._28_2_ = auVar25._0_2_;
          auVar25._30_2_ = auVar25._0_2_;
          auVar26 = vpsllw_avx2(auVar25,ZEXT416((uint)upsample_above));
          auVar26 = vpsrlw_avx2(auVar26,1);
          auVar27 = vpand_avx2(auVar26,auVar18);
        }
        auVar26 = vpmovzxbw_avx2(auVar14);
        auVar19 = vpmovzxbw_avx2(auVar21);
        auVar19 = vpsubw_avx2(auVar19,auVar26);
        auVar19 = vpmullw_avx2(auVar19,auVar27);
        auVar26 = vpsllw_avx2(auVar26,5);
        auVar26 = vpaddw_avx2(auVar26,auVar16);
        auVar26 = vpaddw_avx2(auVar19,auVar26);
        auVar26 = vpsrlw_avx2(auVar26,5);
        auVar14 = vpackuswb_avx(auVar26._0_16_,auVar26._16_16_);
        auVar14 = vpblendvb_avx(auVar20,auVar14,*(undefined1 (*) [16])BaseMask[uVar4]);
        *pauVar9 = auVar14;
        uVar11 = uVar11 + dx;
        uVar13 = uVar13 + 1;
        pauVar9 = pauVar9 + 1;
      } while (uVar8 != uVar13);
      puVar6 = local_438;
      do {
        uVar3 = puVar6[1];
        *(undefined8 *)dst = *puVar6;
        *(undefined8 *)(dst + 8) = uVar3;
        puVar6 = puVar6 + 2;
        dst = dst + stride;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  else {
    if (bw == 0x20) {
      dr_prediction_z1_32xN_avx2(bh,dst,stride,above,dx,(int)left);
      return;
    }
    if (bw == 0x40) {
      dr_prediction_z1_64xN_avx2(bh,dst,stride,above,dx,(int)left);
      return;
    }
  }
  return;
}

Assistant:

void av1_dr_prediction_z1_avx2(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                               const uint8_t *above, const uint8_t *left,
                               int upsample_above, int dx, int dy) {
  (void)left;
  (void)dy;
  switch (bw) {
    case 4:
      dr_prediction_z1_4xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 8:
      dr_prediction_z1_8xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 16:
      dr_prediction_z1_16xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 32:
      dr_prediction_z1_32xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 64:
      dr_prediction_z1_64xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    default: break;
  }
  return;
}